

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite_orm.h
# Opt level: O0

string * __thiscall
sqlite_orm::internal::
table_t<relive::Url,sqlite_orm::internal::column_t<relive::Url,long,long_const&(relive::Url::*)()const,void(relive::Url::*)(long),sqlite_orm::constraints::autoincrement_t,sqlite_orm::constraints::primary_key_t<>>,sqlite_orm::internal::column_t<relive::Url,long,long_const&(relive::Url::*)()const,void(relive::Url::*)(long)>,sqlite_orm::internal::column_t<relive::Url,std::__cxx11::string,std::__cxx11::string_const&(relive::Url::*)()const,void(relive::Url::*)(std::__cxx11::string)>,sqlite_orm::internal::column_t<relive::Url,long,long_const&(relive::Url::*)()const,void(relive::Url::*)(long)>,sqlite_orm::internal::column_t<relive::Url,int,int_const&(relive::Url::*)()const,void(relive::Url::*)(int)>,sqlite_orm::internal::column_t<relive::Url,std::__cxx11::string,std::__cxx11::string_const&(relive::Url::*)()const,void(relive::Url::*)(std::__cxx11::string)>>
::find_column_name<int,relive::Url,void>
          (table_t<relive::Url,_sqlite_orm::internal::column_t<relive::Url,_long,_const_long_&(relive::Url::*)()_const,_void_(relive::Url::*)(long),_sqlite_orm::constraints::autoincrement_t,_sqlite_orm::constraints::primary_key_t<>_>,_sqlite_orm::internal::column_t<relive::Url,_long,_const_long_&(relive::Url::*)()_const,_void_(relive::Url::*)(long)>,_sqlite_orm::internal::column_t<relive::Url,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&(relive::Url::*)()_const,_void_(relive::Url::*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>,_sqlite_orm::internal::column_t<relive::Url,_long,_const_long_&(relive::Url::*)()_const,_void_(relive::Url::*)(long)>,_sqlite_orm::internal::column_t<relive::Url,_int,_const_int_&(relive::Url::*)()_const,_void_(relive::Url::*)(int)>,_sqlite_orm::internal::column_t<relive::Url,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&(relive::Url::*)()_const,_void_(relive::Url::*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
           *this,offset_in_Url_to_int m)

{
  table_t<relive::Url,_sqlite_orm::internal::column_t<relive::Url,_long,_const_long_&(relive::Url::*)()_const,_void_(relive::Url::*)(long),_sqlite_orm::constraints::autoincrement_t,_sqlite_orm::constraints::primary_key_t<>_>,_sqlite_orm::internal::column_t<relive::Url,_long,_const_long_&(relive::Url::*)()_const,_void_(relive::Url::*)(long)>,_sqlite_orm::internal::column_t<relive::Url,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&(relive::Url::*)()_const,_void_(relive::Url::*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>,_sqlite_orm::internal::column_t<relive::Url,_long,_const_long_&(relive::Url::*)()_const,_void_(relive::Url::*)(long)>,_sqlite_orm::internal::column_t<relive::Url,_int,_const_int_&(relive::Url::*)()_const,_void_(relive::Url::*)(int)>,_sqlite_orm::internal::column_t<relive::Url,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&(relive::Url::*)()_const,_void_(relive::Url::*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  *in_RDI;
  string *res;
  table_t<relive::Url,_sqlite_orm::internal::column_t<relive::Url,_long,_const_long_&(relive::Url::*)()_const,_void_(relive::Url::*)(long),_sqlite_orm::constraints::autoincrement_t,_sqlite_orm::constraints::primary_key_t<>_>,_sqlite_orm::internal::column_t<relive::Url,_long,_const_long_&(relive::Url::*)()_const,_void_(relive::Url::*)(long)>,_sqlite_orm::internal::column_t<relive::Url,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&(relive::Url::*)()_const,_void_(relive::Url::*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>,_sqlite_orm::internal::column_t<relive::Url,_long,_const_long_&(relive::Url::*)()_const,_void_(relive::Url::*)(long)>,_sqlite_orm::internal::column_t<relive::Url,_int,_const_int_&(relive::Url::*)()_const,_void_(relive::Url::*)(int)>,_sqlite_orm::internal::column_t<relive::Url,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&(relive::Url::*)()_const,_void_(relive::Url::*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  *this_00;
  
  this_00 = in_RDI;
  std::__cxx11::string::string((string *)in_RDI);
  for_each_column_with_field_type<int,sqlite_orm::internal::table_t<relive::Url,sqlite_orm::internal::column_t<relive::Url,long,long_const&(relive::Url::*)()const,void(relive::Url::*)(long),sqlite_orm::constraints::autoincrement_t,sqlite_orm::constraints::primary_key_t<>>,sqlite_orm::internal::column_t<relive::Url,long,long_const&(relive::Url::*)()const,void(relive::Url::*)(long)>,sqlite_orm::internal::column_t<relive::Url,std::__cxx11::string,std::__cxx11::string_const&(relive::Url::*)()const,void(relive::Url::*)(std::__cxx11::string)>,sqlite_orm::internal::column_t<relive::Url,long,long_const&(relive::Url::*)()const,void(relive::Url::*)(long)>,sqlite_orm::internal::column_t<relive::Url,int,int_const&(relive::Url::*)()const,void(relive::Url::*)(int)>,sqlite_orm::internal::column_t<relive::Url,std::__cxx11::string,std::__cxx11::string_const&(relive::Url::*)()const,void(relive::Url::*)(std::__cxx11::string)>>::find_column_name<int,relive::Url,void>(int_relive::Url::*)const::_lambda(auto:1&)_1_>
            (this_00,(anon_class_16_2_de34c1f6 *)in_RDI);
  return (string *)in_RDI;
}

Assistant:

std::string find_column_name(F O::*m) const {
        std::string res;
        this->template for_each_column_with_field_type<F>([&res, m](auto &c) {
          if(c.member_pointer == m) {
              res = c.name;
          }
        });
        return res;
    }